

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

string * cppwinrt::file_to_string(string *__return_storage_ptr__,string *filename)

{
  basic_filebuf<char,_std::char_traits<char>_> *local_3c0 [3];
  stringstream local_3a8 [392];
  undefined1 local_220 [8];
  ifstream file;
  string *filename_local;
  
  std::ifstream::ifstream(local_220,(string *)filename,_S_bin);
  std::__cxx11::stringstream::stringstream(local_3a8);
  local_3c0[0] = (basic_filebuf<char,_std::char_traits<char>_> *)std::ifstream::rdbuf();
  std::operator<<((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3a8,local_3c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_3a8);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

inline std::string file_to_string(std::string const& filename)
    {
        std::ifstream file(filename, std::ios::binary);
        return static_cast<std::stringstream const&>(std::stringstream() << file.rdbuf()).str();
    }